

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListDatatypeValidator.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::ListDatatypeValidator::getCanonicalRepresentation
          (ListDatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  undefined2 *puVar1;
  int iVar2;
  XMLSize_t XVar3;
  undefined4 extraout_var;
  DatatypeValidator *pDVar4;
  char16_t *pcVar5;
  XMLCh *src;
  XMLCh *__dest;
  MemoryManager *local_b0;
  XMLCh *oldBuf;
  XMLSize_t itemLen;
  XMLCh *itemCanRep;
  uint i;
  DatatypeValidator *itemDv;
  XMLCh *retBufPtr;
  XMLCh *retBuf;
  XMLSize_t retBufSize;
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_> local_50;
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_> janName;
  BaseRefVectorOf<char16_t> *tokenVector;
  ListDatatypeValidator *temp;
  MemoryManager *toUse;
  bool toValidate_local;
  MemoryManager *memMgr_local;
  XMLCh *rawData_local;
  ListDatatypeValidator *this_local;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  local_b0 = memMgr;
  if (memMgr == (MemoryManager *)0x0) {
    local_b0 = DatatypeValidator::getMemoryManager((DatatypeValidator *)this);
  }
  setContent(this,rawData);
  janName.fData = XMLString::tokenizeString(rawData,local_b0);
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_>::Janitor(&local_50,janName.fData);
  if (toValidate) {
    checkContent(this,janName.fData,rawData,(ValidationContext *)0x0,false,local_b0);
  }
  XVar3 = XMLString::stringLen(rawData);
  retBuf = (XMLCh *)(XVar3 * 2);
  iVar2 = (*local_b0->_vptr_MemoryManager[3])(local_b0,XVar3 << 2);
  itemDv = (DatatypeValidator *)CONCAT44(extraout_var,iVar2);
  *(undefined2 *)&(itemDv->super_XSerializable)._vptr_XSerializable = 0;
  pDVar4 = getItemTypeDTV(this);
  retBufPtr = (XMLCh *)itemDv;
  for (itemCanRep._4_4_ = 0; XVar3 = BaseRefVectorOf<char16_t>::size(janName.fData),
      itemCanRep._4_4_ < XVar3; itemCanRep._4_4_ = itemCanRep._4_4_ + 1) {
    pcVar5 = BaseRefVectorOf<char16_t>::elementAt(janName.fData,(ulong)itemCanRep._4_4_);
    iVar2 = (*(pDVar4->super_XSerializable)._vptr_XSerializable[7])(pDVar4,pcVar5,local_b0,0);
    src = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
    XVar3 = XMLString::stringLen(src);
    if (retBufPtr + (long)retBuf <=
        (XMLCh *)((long)&(itemDv->super_XSerializable)._vptr_XSerializable + XVar3 * 2 + 4)) {
      iVar2 = (*local_b0->_vptr_MemoryManager[3])(local_b0,(long)retBuf << 3);
      __dest = (XMLCh *)CONCAT44(extraout_var_01,iVar2);
      memcpy(__dest,retBufPtr,(long)retBuf * 2);
      itemDv = (DatatypeValidator *)((long)__dest + ((long)itemDv - (long)retBufPtr));
      (*local_b0->_vptr_MemoryManager[4])(local_b0,retBufPtr);
      retBuf = (XMLCh *)((long)retBuf << 2);
      retBufPtr = __dest;
    }
    XMLString::catString((XMLCh *)itemDv,src);
    puVar1 = (undefined2 *)((long)&(itemDv->super_XSerializable)._vptr_XSerializable + XVar3 * 2);
    itemDv = (DatatypeValidator *)(puVar1 + 1);
    *puVar1 = 0x20;
    *(undefined2 *)&(itemDv->super_XSerializable)._vptr_XSerializable = 0;
    (*local_b0->_vptr_MemoryManager[4])(local_b0,src);
  }
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_>::~Janitor(&local_50);
  return retBufPtr;
}

Assistant:

const XMLCh* ListDatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                             ,       MemoryManager* const memMgr
                                                             ,       bool                 toValidate) const
{
    MemoryManager* toUse = memMgr? memMgr : getMemoryManager();
    ListDatatypeValidator* temp = (ListDatatypeValidator*) this;
    temp->setContent(rawData);
    BaseRefVectorOf<XMLCh>* tokenVector = XMLString::tokenizeString(rawData, toUse);
    Janitor<BaseRefVectorOf<XMLCh> > janName(tokenVector);    

    if (toValidate)
    {
        try
        {
            temp->checkContent(tokenVector, rawData, 0, false, toUse);
        }
        catch (...)
        {
            return 0;
        }
    }
   
    XMLSize_t retBufSize = 2 * XMLString::stringLen(rawData);
    XMLCh* retBuf = (XMLCh*) toUse->allocate(retBufSize * sizeof(XMLCh));
    retBuf[0] = 0;
    XMLCh* retBufPtr = retBuf;
    DatatypeValidator* itemDv = this->getItemTypeDTV();

    try 
    {
        for (unsigned int i = 0; i < tokenVector->size(); i++)
        {
            XMLCh* itemCanRep = (XMLCh*) itemDv->getCanonicalRepresentation(tokenVector->elementAt(i), toUse, false);
            XMLSize_t itemLen = XMLString::stringLen(itemCanRep); 

            if(retBufPtr+itemLen+2 >= retBuf+retBufSize)
            {
                // need to resize
                XMLCh * oldBuf = retBuf;
                retBuf = (XMLCh*) toUse->allocate(retBufSize * sizeof(XMLCh) * 4);
                memcpy(retBuf, oldBuf, retBufSize * sizeof(XMLCh ));
                retBufPtr = (retBufPtr - oldBuf) + retBuf;
                toUse->deallocate(oldBuf);
                retBufSize <<= 2;
            }

            XMLString::catString(retBufPtr, itemCanRep);
            retBufPtr = retBufPtr + itemLen;
            *(retBufPtr++) = chSpace;
            *(retBufPtr) = chNull;
            toUse->deallocate(itemCanRep);
        }

        return retBuf;

    }
    catch (...)
    {
        return 0;
    }
}